

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O3

void compute_Perms_value_V5_clear(string *encryption_key,EncryptionData *data,uchar *k)

{
  ulong uVar1;
  uchar uVar2;
  int i;
  long lVar3;
  
  uVar1 = (ulong)(uint)data->P | 0xffffffff00000000;
  lVar3 = 0;
  do {
    k[lVar3] = (uchar)uVar1;
    uVar1 = uVar1 >> 8;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 8);
  uVar2 = 'F';
  if (data->encrypt_metadata != false) {
    uVar2 = 'T';
  }
  k[8] = uVar2;
  k[9] = 'a';
  k[10] = 'd';
  k[0xb] = 'b';
  QUtil::initializeWithRandomBytes(k + 0xc,4);
  return;
}

Assistant:

void
compute_Perms_value_V5_clear(
    std::string const& encryption_key, QPDF::EncryptionData const& data, unsigned char k[16])
{
    // From algorithm 3.10 from the PDF 1.7 extension level 3
    unsigned long long extended_perms =
        0xffffffff00000000LL | static_cast<unsigned long long>(data.getP());
    for (int i = 0; i < 8; ++i) {
        k[i] = static_cast<unsigned char>(extended_perms & 0xff);
        extended_perms >>= 8;
    }
    k[8] = data.getEncryptMetadata() ? 'T' : 'F';
    k[9] = 'a';
    k[10] = 'd';
    k[11] = 'b';
    QUtil::initializeWithRandomBytes(k + 12, 4);
}